

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool Truncate(string *path,size_t size,string *err)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  char *__s;
  
  iVar2 = truncate((path->_M_dataplus)._M_p,size);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    __s = strerror(*piVar3);
    pcVar1 = (char *)err->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)__s);
  }
  return -1 < iVar2;
}

Assistant:

bool Truncate(const string& path, size_t size, string* err) {
#ifdef _WIN32
  int fh = _sopen(path.c_str(), _O_RDWR | _O_CREAT, _SH_DENYNO,
                  _S_IREAD | _S_IWRITE);
  int success = _chsize(fh, size);
  _close(fh);
#else
  int success = truncate(path.c_str(), size);
#endif
  // Both truncate() and _chsize() return 0 on success and set errno and return
  // -1 on failure.
  if (success < 0) {
    *err = strerror(errno);
    return false;
  }
  return true;
}